

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.h
# Opt level: O0

void __thiscall
GrcErrorList::AddWarning(GrcErrorList *this,int nID,GdlObject *pgdlobj,string *staMsg)

{
  string *in_RCX;
  string *in_stack_00000040;
  GrpLineAndFile *in_stack_00000048;
  GdlObject *in_stack_00000050;
  string local_40 [64];
  
  std::__cxx11::string::string(local_40,in_RCX);
  AddItem((GrcErrorList *)pgdlobj,staMsg._7_1_,(int)staMsg,in_stack_00000050,in_stack_00000048,
          in_stack_00000040);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void AddWarning(int nID, GdlObject * pgdlobj, std::string staMsg)
	{
		AddItem(false, nID, pgdlobj, NULL, staMsg);
	}